

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O1

bool __thiscall cmCTestTestHandler::GetListOfTests(cmCTestTestHandler *this)

{
  pointer pcVar1;
  cmCTest *pcVar2;
  cmState *pcVar3;
  bool bVar4;
  string *psVar5;
  size_t sVar6;
  cmValue cVar7;
  bool bVar8;
  char *__s;
  string_view value;
  ostringstream cmCTestLog_msg_1;
  cmake cm;
  cmMakefile mf;
  cmGlobalGenerator gg;
  _Any_data local_1f88;
  code *local_1f78;
  code *pcStack_1f70;
  _Any_data local_1f68;
  code *local_1f58;
  code *pcStack_1f50;
  _Any_data local_1f48;
  code *local_1f38;
  code *pcStack_1f30;
  undefined1 local_1f28 [16];
  undefined1 local_1f18 [32];
  bool local_1ef8;
  ios_base local_1eb8 [264];
  pointer local_1db0;
  undefined1 local_1da0 [32];
  unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
  local_1d80 [237];
  cmState *local_1618;
  cmState *local_1610;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcStack_1608;
  size_type local_1600;
  undefined1 local_14e8 [112];
  ios_base local_1478 [3416];
  cmGlobalGenerator local_720;
  
  if ((this->IncludeRegExp)._M_string_length != 0) {
    cmsys::RegularExpression::compile
              (&this->IncludeTestsRegularExpression,(this->IncludeRegExp)._M_dataplus._M_p);
  }
  if ((this->ExcludeRegExp)._M_string_length != 0) {
    cmsys::RegularExpression::compile
              (&this->ExcludeTestsRegularExpression,(this->ExcludeRegExp)._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_14e8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_14e8,"Constructing a list of tests",0x1c);
  std::ios::widen((char)(ostringstream *)local_14e8 +
                  (char)*(undefined8 *)(local_14e8._0_8_ + -0x18));
  std::ostream::put((char)local_14e8);
  std::ostream::flush();
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x712,(char *)local_1da0._16_8_,(this->super_cmCTestGenericHandler).Quiet);
  if ((unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_> *)
      local_1da0._16_8_ != local_1d80) {
    operator_delete((void *)local_1da0._16_8_,
                    (ulong)((long)local_1d80[0]._M_t.
                                  super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                                  .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>.
                                  _M_head_impl + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_14e8);
  std::ios_base::~ios_base(local_1478);
  cmake::cmake((cmake *)(local_1da0 + 0x10),RoleScript,CTest,Normal);
  pcVar1 = local_14e8 + 0x10;
  local_14e8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_14e8,"");
  cmake::SetHomeDirectory((cmake *)(local_1da0 + 0x10),(string *)local_14e8);
  if ((pointer)local_14e8._0_8_ != pcVar1) {
    operator_delete((void *)local_14e8._0_8_,local_14e8._16_8_ + 1);
  }
  local_14e8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_14e8,"");
  cmake::SetHomeOutputDirectory((cmake *)(local_1da0 + 0x10),(string *)local_14e8);
  if ((pointer)local_14e8._0_8_ != pcVar1) {
    operator_delete((void *)local_14e8._0_8_,local_14e8._16_8_ + 1);
  }
  local_14e8._16_8_ = local_1600;
  local_14e8._0_8_ = local_1610;
  local_14e8._8_8_ = pcStack_1608;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_14e8);
  cmGlobalGenerator::cmGlobalGenerator(&local_720,(cmake *)(local_1da0 + 0x10));
  local_1f18._0_8_ = local_1600;
  local_1f28._0_8_ = local_1610;
  local_1f28._8_8_ = pcStack_1608;
  cmMakefile::cmMakefile((cmMakefile *)local_14e8,&local_720,(cmStateSnapshot *)local_1f28);
  local_1f28._0_8_ = (cmState *)local_1f18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1f28,"CTEST_CONFIGURATION_TYPE","");
  psVar5 = cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
  value._M_str = (psVar5->_M_dataplus)._M_p;
  value._M_len = psVar5->_M_string_length;
  cmMakefile::AddDefinition((cmMakefile *)local_14e8,(string *)local_1f28,value);
  if ((cmState *)local_1f28._0_8_ != (cmState *)local_1f18) {
    operator_delete((void *)local_1f28._0_8_,local_1f18._0_8_ + 1);
  }
  pcVar3 = local_1618;
  local_1f28._0_8_ = (cmState *)local_1f18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f28,"add_test","");
  local_1f38 = (code *)0x0;
  pcStack_1f30 = (code *)0x0;
  local_1f48._M_unused._M_object = (void *)0x0;
  local_1f48._8_8_ = 0;
  local_1f48._M_unused._M_object = operator_new(0x10);
  *(cmCTestTestHandler **)((long)local_1f48._M_unused._0_8_ + 8) = this;
  *(undefined ***)local_1f48._M_unused._0_8_ = &PTR__cmCTestCommand_00b38c20;
  pcStack_1f30 = std::
                 _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_(anonymous_namespace)::cmCTestAddTestCommand>
                 ::_M_invoke;
  local_1f38 = std::
               _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_(anonymous_namespace)::cmCTestAddTestCommand>
               ::_M_manager;
  cmState::AddBuiltinCommand(pcVar3,(string *)local_1f28,(Command *)&local_1f48);
  if (local_1f38 != (code *)0x0) {
    (*local_1f38)(&local_1f48,&local_1f48,__destroy_functor);
  }
  if ((cmState *)local_1f28._0_8_ != (cmState *)local_1f18) {
    operator_delete((void *)local_1f28._0_8_,local_1f18._0_8_ + 1);
  }
  pcVar3 = local_1618;
  local_1f28._0_8_ = (cmState *)local_1f18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f28,"subdirs","");
  cmState::AddBuiltinCommand
            (pcVar3,(string *)local_1f28,anon_unknown.dwarf_38f1ab::cmCTestSubdirCommand);
  if ((cmState *)local_1f28._0_8_ != (cmState *)local_1f18) {
    operator_delete((void *)local_1f28._0_8_,local_1f18._0_8_ + 1);
  }
  pcVar3 = local_1618;
  local_1f28._0_8_ = (cmState *)local_1f18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f28,"add_subdirectory","");
  cmState::AddBuiltinCommand
            (pcVar3,(string *)local_1f28,anon_unknown.dwarf_38f1ab::cmCTestAddSubdirectoryCommand);
  if ((cmState *)local_1f28._0_8_ != (cmState *)local_1f18) {
    operator_delete((void *)local_1f28._0_8_,local_1f18._0_8_ + 1);
  }
  pcVar3 = local_1618;
  local_1f28._0_8_ = (cmState *)local_1f18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f28,"set_tests_properties","");
  local_1f58 = (code *)0x0;
  pcStack_1f50 = (code *)0x0;
  local_1f68._M_unused._M_object = (void *)0x0;
  local_1f68._8_8_ = 0;
  local_1f68._M_unused._M_object = operator_new(0x10);
  *(cmCTestTestHandler **)((long)local_1f68._M_unused._0_8_ + 8) = this;
  *(undefined ***)local_1f68._M_unused._0_8_ = &PTR__cmCTestCommand_00b38c98;
  pcStack_1f50 = std::
                 _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_(anonymous_namespace)::cmCTestSetTestsPropertiesCommand>
                 ::_M_invoke;
  local_1f58 = std::
               _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_(anonymous_namespace)::cmCTestSetTestsPropertiesCommand>
               ::_M_manager;
  cmState::AddBuiltinCommand(pcVar3,(string *)local_1f28,(Command *)&local_1f68);
  if (local_1f58 != (code *)0x0) {
    (*local_1f58)(&local_1f68,&local_1f68,__destroy_functor);
  }
  if ((cmState *)local_1f28._0_8_ != (cmState *)local_1f18) {
    operator_delete((void *)local_1f28._0_8_,local_1f18._0_8_ + 1);
  }
  pcVar3 = local_1618;
  local_1f28._0_8_ = (cmState *)local_1f18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1f28,"set_directory_properties","");
  cmState::RemoveBuiltinCommand(pcVar3,(string *)local_1f28);
  if ((cmState *)local_1f28._0_8_ != (cmState *)local_1f18) {
    operator_delete((void *)local_1f28._0_8_,local_1f18._0_8_ + 1);
  }
  local_1f28._0_8_ = (cmState *)local_1f18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1f28,"set_directory_properties","");
  local_1f78 = (code *)0x0;
  pcStack_1f70 = (code *)0x0;
  local_1f88._M_unused._M_object = (void *)0x0;
  local_1f88._8_8_ = 0;
  local_1f88._M_unused._M_object = operator_new(0x10);
  *(cmCTestTestHandler **)((long)local_1f88._M_unused._0_8_ + 8) = this;
  *(undefined ***)local_1f88._M_unused._0_8_ = &PTR__cmCTestCommand_00b38cd8;
  pcStack_1f70 = std::
                 _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_(anonymous_namespace)::cmCTestSetDirectoryPropertiesCommand>
                 ::_M_invoke;
  local_1f78 = std::
               _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_(anonymous_namespace)::cmCTestSetDirectoryPropertiesCommand>
               ::_M_manager;
  cmState::AddBuiltinCommand(local_1618,(string *)local_1f28,(Command *)&local_1f88);
  if (local_1f78 != (code *)0x0) {
    (*local_1f78)(&local_1f88,&local_1f88,__destroy_functor);
  }
  if ((cmState *)local_1f28._0_8_ != (cmState *)local_1f18) {
    operator_delete((void *)local_1f28._0_8_,local_1f18._0_8_ + 1);
  }
  __s = "CTestTestfile.cmake";
  bVar4 = cmsys::SystemTools::FileExists("CTestTestfile.cmake");
  if (!bVar4) {
    __s = "DartTestfile.txt";
    bVar4 = cmsys::SystemTools::FileExists("DartTestfile.txt");
    bVar8 = true;
    if (!bVar4) goto LAB_00211cb6;
  }
  local_1f28._0_8_ = (cmState *)local_1f18;
  sVar6 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f28,__s,__s + sVar6);
  bVar4 = cmMakefile::ReadListFile((cmMakefile *)local_14e8,(string *)local_1f28);
  if ((cmState *)local_1f28._0_8_ != (cmState *)local_1f18) {
    operator_delete((void *)local_1f28._0_8_,local_1f18._0_8_ + 1);
  }
  if (((bVar4) && (cmSystemTools::s_ErrorOccurred == false)) &&
     (cmSystemTools::s_FatalErrorOccurred == false)) {
    bVar4 = cmSystemTools::GetInterruptFlag();
    if (!bVar4) {
      local_1f28._0_8_ = (cmState *)local_1f18;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1f28,"CTEST_RESOURCE_SPEC_FILE","");
      cVar7 = cmMakefile::GetDefinition((cmMakefile *)local_14e8,(string *)local_1f28);
      if ((cmState *)local_1f28._0_8_ != (cmState *)local_1f18) {
        operator_delete((void *)local_1f28._0_8_,local_1f18._0_8_ + 1);
      }
      if (cVar7.Value != (string *)0x0 && (this->ResourceSpecFile)._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)&this->ResourceSpecFile);
      }
      if ((this->TestListFile)._M_string_length != 0) {
        ReadTestListFile((optional<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_1f28,this,&this->TestListFile);
        std::
        _Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_M_move_assign((_Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&this->TestsToRunByName,
                         (_Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_1f28);
        if (local_1ef8 == true) {
          local_1ef8 = false;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1f28);
        }
        if ((this->TestsToRunByName).
            super__Optional_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_engaged == false) goto LAB_00211cb4;
      }
      if ((this->ExcludeTestListFile)._M_string_length != 0) {
        ReadTestListFile((optional<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_1f28,this,&this->ExcludeTestListFile);
        std::
        _Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_M_move_assign((_Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&this->TestsToExcludeByName,
                         (_Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_1f28);
        if (local_1ef8 == true) {
          local_1ef8 = false;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1f28);
        }
        if ((this->TestsToExcludeByName).
            super__Optional_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_engaged == false) goto LAB_00211cb4;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f28);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f28,"Done constructing a list of tests",0x21);
      std::ios::widen((char)(ostream *)local_1f28 + (char)*(undefined8 *)(local_1f28._0_8_ + -0x18))
      ;
      std::ostream::put((char)local_1f28);
      std::ostream::flush();
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x755,(char *)local_1db0,(this->super_cmCTestGenericHandler).Quiet);
      if (local_1db0 != (pointer)local_1da0) {
        operator_delete(local_1db0,(ulong)(local_1da0._0_8_ + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f28);
      std::ios_base::~ios_base(local_1eb8);
      bVar8 = true;
      goto LAB_00211cb6;
    }
  }
LAB_00211cb4:
  bVar8 = false;
LAB_00211cb6:
  cmMakefile::~cmMakefile((cmMakefile *)local_14e8);
  cmGlobalGenerator::~cmGlobalGenerator(&local_720);
  cmake::~cmake((cmake *)(local_1da0 + 0x10));
  return bVar8;
}

Assistant:

bool cmCTestTestHandler::GetListOfTests()
{
  if (!this->IncludeRegExp.empty()) {
    this->IncludeTestsRegularExpression.compile(this->IncludeRegExp);
  }
  if (!this->ExcludeRegExp.empty()) {
    this->ExcludeTestsRegularExpression.compile(this->ExcludeRegExp);
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Constructing a list of tests" << std::endl, this->Quiet);
  cmake cm(cmake::RoleScript, cmState::CTest);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  cmMakefile mf(&gg, cm.GetCurrentSnapshot());
  mf.AddDefinition("CTEST_CONFIGURATION_TYPE", this->CTest->GetConfigType());

  // Add handler for ADD_TEST
  cm.GetState()->AddBuiltinCommand("add_test", cmCTestAddTestCommand(this));

  // Add handler for SUBDIRS
  cm.GetState()->AddBuiltinCommand("subdirs", cmCTestSubdirCommand);

  // Add handler for ADD_SUBDIRECTORY
  cm.GetState()->AddBuiltinCommand("add_subdirectory",
                                   cmCTestAddSubdirectoryCommand);

  // Add handler for SET_TESTS_PROPERTIES
  cm.GetState()->AddBuiltinCommand("set_tests_properties",
                                   cmCTestSetTestsPropertiesCommand(this));

  // Add handler for SET_DIRECTORY_PROPERTIES
  cm.GetState()->RemoveBuiltinCommand("set_directory_properties");
  cm.GetState()->AddBuiltinCommand("set_directory_properties",
                                   cmCTestSetDirectoryPropertiesCommand(this));

  const char* testFilename;
  if (cmSystemTools::FileExists("CTestTestfile.cmake")) {
    // does the CTestTestfile.cmake exist ?
    testFilename = "CTestTestfile.cmake";
  } else if (cmSystemTools::FileExists("DartTestfile.txt")) {
    // does the DartTestfile.txt exist ?
    testFilename = "DartTestfile.txt";
  } else {
    return true;
  }

  if (!mf.ReadListFile(testFilename)) {
    return false;
  }
  if (cmSystemTools::GetErrorOccurredFlag()) {
    // SEND_ERROR or FATAL_ERROR in CTestTestfile or TEST_INCLUDE_FILES
    return false;
  }
  cmValue specFile = mf.GetDefinition("CTEST_RESOURCE_SPEC_FILE");
  if (this->ResourceSpecFile.empty() && specFile) {
    this->ResourceSpecFile = *specFile;
  }

  if (!this->TestListFile.empty()) {
    this->TestsToRunByName = this->ReadTestListFile(this->TestListFile);
    if (!this->TestsToRunByName) {
      return false;
    }
  }
  if (!this->ExcludeTestListFile.empty()) {
    this->TestsToExcludeByName =
      this->ReadTestListFile(this->ExcludeTestListFile);
    if (!this->TestsToExcludeByName) {
      return false;
    }
  }

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Done constructing a list of tests" << std::endl,
                     this->Quiet);
  return true;
}